

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
r_code::list<r_exec::HLPController::EEntry>::push_front_free_cell
          (list<r_exec::HLPController::EEntry> *this,EEntry *t)

{
  size_type __n;
  int64_t iVar1;
  reference pvVar2;
  int64_t free;
  EEntry *t_local;
  list<r_exec::HLPController::EEntry> *this_local;
  
  __n = this->free_cells;
  pvVar2 = std::
           vector<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
           ::operator[](&this->cells,this->free_cells);
  this->free_cells = pvVar2->next;
  this->free_cell_count = this->free_cell_count - 1;
  pvVar2 = std::
           vector<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
           ::operator[](&this->cells,__n);
  r_exec::HLPController::EEntry::operator=(&pvVar2->data,t);
  iVar1 = this->used_cells_head;
  pvVar2 = std::
           vector<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
           ::operator[](&this->cells,__n);
  pvVar2->next = iVar1;
  pvVar2 = std::
           vector<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
           ::operator[](&this->cells,__n);
  pvVar2->prev = -1;
  this->used_cells_head = __n;
  return;
}

Assistant:

void push_front_free_cell(const T &t)
    {
        int64_t free = free_cells;
        free_cells = cells[free_cells].next;
        --free_cell_count;
        cells[free].data = t;
        cells[free].next = used_cells_head;
        cells[free].prev = null;
        used_cells_head = free;
    }